

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O3

bool correctWidgetContext(ShortcutContext context,QWidget *w,QWidget *active_window)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  QGraphicsWidget *w_00;
  bool bVar4;
  QMenuBar *this;
  QPlatformMenuBar *pQVar5;
  long lVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  uint uVar9;
  
  if (active_window == (QWidget *)0x0) {
    return false;
  }
  uVar3 = w->data->widget_attributes;
  this = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
  if ((this == (QMenuBar *)0x0) ||
     (pQVar5 = QMenuBar::platformMenuBar(this), pQVar5 == (QPlatformMenuBar *)0x0)) {
LAB_0039e6e8:
    if (-1 < (short)uVar3) {
      return false;
    }
  }
  else if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) == 0) {
    (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5);
    lVar6 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
    if (lVar6 == 0) {
      return false;
    }
    if ((*(long *)(lVar6 + 0x28) == 0) || (*(int *)(*(long *)(lVar6 + 0x28) + 4) == 0)) {
      w = (QWidget *)0x0;
    }
    else {
      w = *(QWidget **)(lVar6 + 0x30);
    }
    goto LAB_0039e6e8;
  }
  if ((w->data->widget_attributes & 1) != 0) {
    return false;
  }
  if (context == WidgetShortcut) {
    pQVar7 = QApplication::focusWidget();
    return w == pQVar7;
  }
  if (context == WidgetWithChildrenShortcut) {
    pQVar7 = QApplication::focusWidget();
    if (pQVar7 == (QWidget *)0x0) {
      return pQVar7 == w;
    }
    if (pQVar7 == w) {
      return pQVar7 == w;
    }
    do {
      uVar9 = (uint)(byte)(pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i;
      if (0x12 < uVar9) {
        return false;
      }
      if ((0x40201U >> (uVar9 & 0x1f) & 1) == 0) {
        return false;
      }
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
      if (pQVar7 == (QWidget *)0x0) {
        return pQVar7 == w;
      }
    } while (pQVar7 != w);
    return pQVar7 == w;
  }
  if (context == ApplicationShortcut) goto LAB_0039e716;
  pQVar7 = QWidget::window(w);
  lVar6 = *(long *)(*(long *)&pQVar7->field_0x8 + 0x78);
  if ((lVar6 != 0) && (w_00 = *(QGraphicsWidget **)(lVar6 + 0x10), w_00 != (QGraphicsWidget *)0x0))
  {
    bVar4 = correctGraphicsWidgetContext(context,w_00,active_window);
    return bVar4;
  }
  if (pQVar7 != active_window) {
    cVar1 = (char)(active_window->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i;
    if (cVar1 == '\t') {
      pQVar8 = QWidget::focusProxy(active_window);
      if (pQVar8 != (QWidget *)0x0) {
        pQVar8 = QWidget::focusProxy(active_window);
        goto LAB_0039e80b;
      }
    }
    else if ((cVar1 == '\v') &&
            (pQVar8 = *(QWidget **)(*(long *)&active_window->field_0x8 + 0x10),
            pQVar8 != (QWidget *)0x0)) {
LAB_0039e80b:
      active_window = QWidget::window(pQVar8);
    }
  }
  pQVar8 = w;
  if ((active_window != pQVar7) &&
     (lVar6 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject), lVar6 == 0)) {
    return false;
  }
  do {
    bVar2 = (byte)(pQVar8->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                  super_QFlagsStorage<Qt::WindowType>.i;
    if (bVar2 == 0x12) {
      for (pQVar7 = QApplication::focusWidget(); (pQVar7 != (QWidget *)0x0 && (pQVar7 != pQVar8));
          pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10)) {
      }
      return pQVar8 == pQVar7;
    }
  } while (((bVar2 & 1) == 0) &&
          (pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10), pQVar8 != (QWidget *)0x0));
LAB_0039e716:
  bVar4 = QApplicationPrivate::tryModalHelper(w,(QWidget **)0x0);
  return bVar4;
}

Assistant:

static bool correctWidgetContext(Qt::ShortcutContext context, QWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if QT_CONFIG(menubar)
    if (auto menuBar = qobject_cast<QMenuBar *>(w)) {
        if (auto *pmb = menuBar->platformMenuBar()) {
            if (menuBar->parentWidget()) {
                visible = true;
            } else {
                if (auto *ww = qobject_cast<QWidgetWindow *>(pmb->parentWindow()))
                    w = ww->widget(); // Good enough since we only care about the window
                else
                    return false; // This is not a QWidget window. We won't deliver
            }
        }
    }
#endif

    if (!visible || !w->isEnabled())
        return false;

    if (context == Qt::ApplicationShortcut)
        return QApplicationPrivate::tryModalHelper(w, nullptr); // true, unless w is shadowed by a modal dialog

    if (context == Qt::WidgetShortcut)
        return w == QApplication::focusWidget();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QWidget *tw = QApplication::focusWidget();
        while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup || tw->windowType() == Qt::SubWindow))
            tw = tw->parentWidget();
        return tw == w;
    }

    // Below is Qt::WindowShortcut context
    QWidget *tlw = w->window();
#if QT_CONFIG(graphicsview)
    if (auto topData = static_cast<QWidgetPrivate *>(QObjectPrivate::get(tlw))->extra.get()) {
        if (topData->proxyWidget) {
            bool res = correctGraphicsWidgetContext(context, topData->proxyWidget, active_window);
            return res;
        }
    }
#endif

    if (active_window && active_window != tlw) {
        /* if a floating tool window is active, keep shortcuts on the parent working.
         * and if a popup window is active (f.ex a completer), keep shortcuts on the
         * focus proxy working */
        if (active_window->windowType() == Qt::Tool && active_window->parentWidget()) {
            active_window = active_window->parentWidget()->window();
        } else if (active_window->windowType() == Qt::Popup && active_window->focusProxy()) {
            active_window = active_window->focusProxy()->window();
        }
    }

    if (active_window != tlw) {
#if QT_CONFIG(menubar)
        // If the tlw is a QMenuBar then we allow it to proceed as this indicates that
        // the QMenuBar is a parentless one and is therefore used for multiple top level
        // windows in the application. This is common on macOS platforms for example.
        if (!qobject_cast<QMenuBar *>(tlw))
#endif
        return false;
    }

    /* if we live in a MDI subwindow, ignore the event if we are
       not the active document window */
    const QWidget* sw = w;
    while (sw && !(sw->windowType() == Qt::SubWindow) && !sw->isWindow())
        sw = sw->parentWidget();
    if (sw && (sw->windowType() == Qt::SubWindow)) {
        QWidget *focus_widget = QApplication::focusWidget();
        while (focus_widget && focus_widget != sw)
            focus_widget = focus_widget->parentWidget();
        return sw == focus_widget;
    }

#if defined(DEBUG_QSHORTCUTMAP)
    qDebug().nospace() << "..true [Pass-through]";
#endif
    return QApplicationPrivate::tryModalHelper(w, nullptr);
}